

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_helpers.hpp
# Opt level: O1

void duckdb::AddToHugeint::AddConstant<duckdb::SumState<duckdb::hugeint_t>,int>
               (SumState<duckdb::hugeint_t> *state,int input,idx_t count)

{
  hugeint_t *phVar1;
  int64_t *piVar2;
  uint64_t uVar3;
  ulong uVar4;
  long lVar5;
  int64_t iVar6;
  uint64_t uVar7;
  hugeint_t addition;
  hugeint_t local_48;
  hugeint_t local_38;
  hugeint_t local_28;
  
  if (input < 0) {
    if (count < 8) {
      if (count != 0) {
        uVar4 = (ulong)input;
        uVar3 = (state->value).lower;
        iVar6 = (state->value).upper;
        lVar5 = uVar4 * count;
        uVar7 = uVar3;
        do {
          uVar7 = uVar7 + uVar4;
          if (-1 < input != uVar4 <= uVar7) {
            iVar6 = iVar6 + (ulong)(-1 < input) * 2 + -1;
            (state->value).upper = iVar6;
          }
          count = count - 1;
        } while (count != 0);
        (state->value).lower = uVar3 + lVar5;
      }
    }
    else {
      duckdb::hugeint_t::hugeint_t(&local_38,(long)input);
      local_48 = Hugeint::Convert<unsigned_long>(count);
      local_28 = (hugeint_t)duckdb::hugeint_t::operator*(&local_38,&local_48);
      duckdb::hugeint_t::operator+=(&state->value,&local_28);
    }
  }
  else {
    phVar1 = &state->value;
    uVar4 = phVar1->lower;
    phVar1->lower = phVar1->lower + (uint)input * count;
    if (CARRY8(uVar4,(uint)input * count)) {
      piVar2 = &(state->value).upper;
      *piVar2 = *piVar2 + 1;
    }
  }
  return;
}

Assistant:

static void AddConstant(STATE &state, T input, idx_t count) {
		// add a constant X number of times
		// fast path: check if value * count fits into a uint64_t
		// note that we check if value * VECTOR_SIZE fits in a uint64_t to avoid having to actually do a division
		// this is still a pretty high number (18014398509481984) so most positive numbers will fit
		if (input >= 0 && uint64_t(input) < (NumericLimits<uint64_t>::Maximum() / STANDARD_VECTOR_SIZE)) {
			// if it does just multiply it and add the value
			uint64_t value = uint64_t(input) * count;
			AddValue(state.value, value, 1);
		} else {
			// if it doesn't fit we have two choices
			// either we loop over count and add the values individually
			// or we convert to a hugeint and multiply the hugeint
			// the problem is that hugeint multiplication is expensive
			// hence we switch here: with a low count we do the loop
			// with a high count we do the hugeint multiplication
			if (count < 8) {
				for (idx_t i = 0; i < count; i++) {
					AddValue(state.value, uint64_t(input), input >= 0);
				}
			} else {
				hugeint_t addition = hugeint_t(input) * Hugeint::Convert(count);
				state.value += addition;
			}
		}
	}